

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator::GenerateBuildingCode
          (ImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  long lVar1;
  bool bVar2;
  Descriptor *pDVar3;
  char *text;
  
  this_00 = this->descriptor_;
  if (((~(byte)this_00[1] & 0x60) == 0) ||
     ((((pDVar3 = FieldDescriptor::message_type(this_00), pDVar3 == (Descriptor *)0x0 &&
        (((byte)this_00[1] & 2) == 0)) && (*(char *)(*(long *)(this_00 + 0x10) + 0x3a) != '\x02'))
      && ((lVar1 = *(long *)(this_00 + 0x28), lVar1 == 0 || ((byte)this_00[1] & 0x10) == 0 ||
          ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))))))) {
    text = "result.$name$_ = $name$_;\n";
  }
  else {
    bVar2 = IsDefaultValueJavaDefault(this->descriptor_);
    if (bVar2) {
      text = 
      "if ($get_has_field_bit_from_local$) {\n  result.$name$_ = $name$_;\n  $set_has_field_bit_to_local$;\n}\n"
      ;
    }
    else {
      text = 
      "if ($get_has_field_bit_from_local$) {\n  $set_has_field_bit_to_local$;\n}\nresult.$name$_ = $name$_;\n"
      ;
    }
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutablePrimitiveFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  if (HasHazzer(descriptor_)) {
    if (IsDefaultValueJavaDefault(descriptor_)) {
      printer->Print(variables_,
                     "if ($get_has_field_bit_from_local$) {\n"
                     "  result.$name$_ = $name$_;\n"
                     "  $set_has_field_bit_to_local$;\n"
                     "}\n");
    } else {
      printer->Print(variables_,
                     "if ($get_has_field_bit_from_local$) {\n"
                     "  $set_has_field_bit_to_local$;\n"
                     "}\n"
                     "result.$name$_ = $name$_;\n");
    }
  } else {
    printer->Print(variables_, "result.$name$_ = $name$_;\n");
  }
}